

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer-source-line-finder.cc
# Opt level: O3

Result __thiscall
wabt::LexerSourceLineFinder::GetLineOffsets
          (LexerSourceLineFinder *this,int find_line,OffsetRange *out_range)

{
  ulong uVar1;
  pointer pRVar2;
  pointer pRVar3;
  long lVar4;
  char cVar5;
  Result RVar6;
  void *__s;
  Enum EVar7;
  long lVar8;
  value_type *__val;
  OffsetRange OVar9;
  Offset line_offset;
  Offset buffer_file_offset;
  unsigned_long local_60;
  Offset local_58;
  int local_4c;
  ulong local_48;
  size_t local_40;
  OffsetRange *local_38;
  
  local_48 = (ulong)find_line;
  if (local_48 <
      (ulong)((long)(this->line_ranges_).
                    super__Vector_base<wabt::Range<unsigned_long>,_std::allocator<wabt::Range<unsigned_long>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(this->line_ranges_).
                    super__Vector_base<wabt::Range<unsigned_long>,_std::allocator<wabt::Range<unsigned_long>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 4)) {
    OVar9 = GetCachedLine(this,find_line);
    *out_range = OVar9;
    EVar7 = Ok;
  }
  else {
    local_4c = find_line;
    local_38 = out_range;
    __s = operator_new(0x10000);
    memset(__s,0,0x10000);
    pRVar2 = (this->line_ranges_).
             super__Vector_base<wabt::Range<unsigned_long>,_std::allocator<wabt::Range<unsigned_long>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pRVar3 = (this->line_ranges_).
             super__Vector_base<wabt::Range<unsigned_long>,_std::allocator<wabt::Range<unsigned_long>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (pRVar2 == pRVar3) {
      __assert_fail("!line_ranges_.empty()",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/lexer-source-line-finder.cc"
                    ,0x58,"Result wabt::LexerSourceLineFinder::GetLineOffsets(int, OffsetRange *)");
    }
    local_58 = 0;
    if ((ulong)((long)pRVar3 - (long)pRVar2 >> 4) <= local_48) {
      do {
        EVar7 = Error;
        if (this->eof_ != false) goto LAB_00184d4c;
        RVar6 = LexerSource::Tell((this->source_)._M_t.
                                  super___uniq_ptr_impl<wabt::LexerSource,_std::default_delete<wabt::LexerSource>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_wabt::LexerSource_*,_std::default_delete<wabt::LexerSource>_>
                                  .super__Head_base<0UL,_wabt::LexerSource_*,_false>._M_head_impl,
                                  &local_58);
        if (RVar6.enum_ == Error) goto LAB_00184d4c;
        local_40 = LexerSource::Fill((this->source_)._M_t.
                                     super___uniq_ptr_impl<wabt::LexerSource,_std::default_delete<wabt::LexerSource>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_wabt::LexerSource_*,_std::default_delete<wabt::LexerSource>_>
                                     .super__Head_base<0UL,_wabt::LexerSource_*,_false>._M_head_impl
                                     ,__s,0x10000);
        if (local_40 < 0x10000) {
          this->eof_ = true;
        }
        if (0 < (long)local_40) {
          uVar1 = (long)__s + local_40;
          lVar8 = 0;
          do {
            cVar5 = *(char *)((long)__s + lVar8);
            if (cVar5 == '\n') {
              local_60 = (local_58 - this->last_cr_) + lVar8;
              std::vector<wabt::Range<unsigned_long>,std::allocator<wabt::Range<unsigned_long>>>::
              emplace_back<unsigned_long&,unsigned_long&>
                        ((vector<wabt::Range<unsigned_long>,std::allocator<wabt::Range<unsigned_long>>>
                          *)&this->line_ranges_,&this->next_line_start_,&local_60);
              this->next_line_start_ = local_60 + this->last_cr_ + 1;
              cVar5 = *(char *)((long)__s + lVar8);
            }
            this->last_cr_ = cVar5 == '\r';
            lVar4 = lVar8 + 1;
            lVar8 = lVar8 + 1;
          } while ((ulong)((long)__s + lVar4) < uVar1);
        }
        if (this->eof_ != false) {
          local_60 = local_40 + local_58;
          std::vector<wabt::Range<unsigned_long>,std::allocator<wabt::Range<unsigned_long>>>::
          emplace_back<unsigned_long&,unsigned_long&>
                    ((vector<wabt::Range<unsigned_long>,std::allocator<wabt::Range<unsigned_long>>>
                      *)&this->line_ranges_,&this->next_line_start_,&local_60);
        }
      } while ((ulong)((long)(this->line_ranges_).
                             super__Vector_base<wabt::Range<unsigned_long>,_std::allocator<wabt::Range<unsigned_long>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(this->line_ranges_).
                             super__Vector_base<wabt::Range<unsigned_long>,_std::allocator<wabt::Range<unsigned_long>_>_>
                             ._M_impl.super__Vector_impl_data._M_start >> 4) <= local_48);
    }
    OVar9 = GetCachedLine(this,local_4c);
    *local_38 = OVar9;
    EVar7 = Ok;
LAB_00184d4c:
    operator_delete(__s,0x10000);
  }
  return (Result)EVar7;
}

Assistant:

Result LexerSourceLineFinder::GetLineOffsets(int find_line,
                                             OffsetRange* out_range) {
  if (IsLineCached(find_line)) {
    *out_range = GetCachedLine(find_line);
    return Result::Ok;
  }

  const size_t kBufferSize = 1 << 16;
  std::vector<char> buffer(kBufferSize);

  assert(!line_ranges_.empty());
  Offset buffer_file_offset = 0;
  while (!IsLineCached(find_line) && !eof_) {
    CHECK_RESULT(source_->Tell(&buffer_file_offset));
    size_t read_size = source_->Fill(buffer.data(), buffer.size());
    if (read_size < buffer.size()) {
      eof_ = true;
    }

    for (auto iter = buffer.begin(), end = iter + read_size; iter < end;
         ++iter) {
      if (*iter == '\n') {
        // Don't include \n or \r in the line range.
        Offset line_offset =
            buffer_file_offset + (iter - buffer.begin()) - last_cr_;
        line_ranges_.emplace_back(next_line_start_, line_offset);
        next_line_start_ = line_offset + last_cr_ + 1;
      }
      last_cr_ = *iter == '\r';
    }

    if (eof_) {
      // Add the final line as an empty range.
      Offset end = buffer_file_offset + read_size;
      line_ranges_.emplace_back(next_line_start_, end);
    }
  }

  if (IsLineCached(find_line)) {
    *out_range = GetCachedLine(find_line);
    return Result::Ok;
  } else {
    assert(eof_);
    return Result::Error;
  }
}